

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

ExpEmit __thiscall FxArrayElement::Emit(FxArrayElement *this,VMFunctionBuilder *build)

{
  BYTE BVar1;
  FxExpression *pFVar2;
  PString *pPVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  PType *pPVar10;
  uint extraout_var;
  uint extraout_var_00;
  ulong uVar11;
  byte bVar12;
  uint uVar13;
  ulong uVar14;
  FScriptPosition *other;
  uint uVar15;
  ulong uVar16;
  byte bVar17;
  uint opc;
  uint uVar18;
  ulong uVar19;
  bool bVar20;
  ulong local_80;
  uint local_6c;
  ulong local_68;
  FString local_38;
  
  pFVar2 = this->Array;
  pPVar10 = (PType *)&pFVar2->ValueType;
  if (this->arrayispointer == true) {
    pPVar10 = *(PType **)pPVar10 + 1;
  }
  pPVar10 = (PType *)(pPVar10->super_PTypeBase).super_DObject._vptr_DObject;
  uVar4 = (*pFVar2->_vptr_FxExpression[9])(pFVar2,build);
  uVar16 = CONCAT44(extraout_var,uVar4);
  uVar18 = (uint)(uVar16 >> 0x10);
  uVar19 = uVar16 >> 0x18;
  local_80 = (ulong)extraout_var;
  uVar7 = extraout_var >> 8;
  iVar5 = (*this->index->_vptr_FxExpression[3])();
  local_68._0_1_ = (byte)(extraout_var >> 8);
  bVar17 = (byte)(uVar4 >> 0x10);
  uVar14 = uVar16;
  if ((char)iVar5 == '\0') {
    uVar6 = (*this->index->_vptr_FxExpression[9])(this->index,build);
    uVar8 = *(uint *)&pPVar10[1].super_PTypeBase.super_DObject.Class;
    iVar5 = 0x54;
    if (0xffff < uVar8) {
      uVar8 = VMFunctionBuilder::GetConstantInt(build,uVar8);
      iVar5 = 0x55;
    }
    local_6c = uVar6 >> 0x18;
    VMFunctionBuilder::Emit(build,iVar5,uVar6 & 0xffff,(VM_SHALF)uVar8);
    bVar12 = (byte)(uVar6 >> 0x10);
    uVar8 = (uint)(CONCAT44(extraout_var_00,uVar6) >> 0x10);
    if ((extraout_var & 1) != 0) {
      if (((this->super_FxExpression).ValueType)->RegType != bVar17) {
        __assert_fail("start.RegType == ValueType->GetRegType()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                      ,0x1ae5,"virtual ExpEmit FxArrayElement::Emit(VMFunctionBuilder *)");
      }
      uVar14 = ((ulong)uVar4 & 0xff0000) >> 0x10;
      uVar7 = VMFunctionBuilder::RegAvailability::Get(build->Registers + uVar14,1);
      uVar15 = uVar4 & 0xffff;
      if ((uVar4 & 0xffff) < 0x100) {
        iVar5 = Emit::LKR_Ops[uVar14];
      }
      else {
        uVar4 = VMFunctionBuilder::GetConstantInt(build,uVar15);
        VMFunctionBuilder::Emit(build,100,uVar6 & 0xffff,uVar6 & 0xffff,uVar4);
        iVar5 = Emit::LKR_Ops[uVar14];
        uVar15 = 0;
      }
      VMFunctionBuilder::Emit(build,iVar5,uVar7 & 0xffff,uVar6 & 0xffff,uVar15);
      uVar4 = 0x1000000;
      if (((extraout_var_00 & 0x100) == 0) && (bVar12 < 4 && (extraout_var_00 & 1) == 0)) {
        VMFunctionBuilder::RegAvailability::Return
                  (build->Registers + (uVar8 & 3),uVar6 & 0xffff,local_6c);
      }
      uVar11 = 0;
      uVar14 = (ulong)uVar7;
      goto LAB_00531efb;
    }
    uVar15 = *(uint *)((long)&pPVar10[1].super_PTypeBase.super_DObject.Class + 4);
    opc = 0xffffffff;
    do {
      opc = opc + 1;
      uVar13 = 1 << ((byte)opc & 0x1f);
    } while (uVar13 < uVar15);
    if ((uVar15 < 2) || ((extraout_var_00 & 0x100) == 0)) {
      bVar20 = (extraout_var_00 & 0x101) == 0;
      uVar9 = uVar6;
    }
    else {
      local_6c = 1;
      uVar9 = VMFunctionBuilder::RegAvailability::Get
                        (build->Registers + (((ulong)uVar6 & 0xff0000) >> 0x10),1);
      uVar15 = *(uint *)((long)&pPVar10[1].super_PTypeBase.super_DObject.Class + 4);
      bVar20 = true;
    }
    uVar9 = uVar9 & 0xffff;
    if (uVar13 == uVar15) {
      if (opc != 0) {
        iVar5 = 0x5b;
        goto LAB_00531c09;
      }
    }
    else {
      opc = VMFunctionBuilder::GetConstantInt(build,uVar15);
      iVar5 = 0x6a;
LAB_00531c09:
      VMFunctionBuilder::Emit(build,iVar5,uVar9,uVar6 & 0xffff,opc);
    }
    if ((bool)(bVar20 & bVar12 < 4)) {
      VMFunctionBuilder::RegAvailability::Return(build->Registers + (uVar8 & 3),uVar9,local_6c);
    }
    if (this->AddressRequested != true) {
      if (bVar17 < 4 && (((byte)local_68 | (byte)extraout_var) & 1) == 0) {
        VMFunctionBuilder::RegAvailability::Return
                  (build->Registers + (uVar18 & 3),uVar4 & 0xffff,uVar4 >> 0x18);
      }
      uVar14 = (ulong)((this->super_FxExpression).ValueType)->RegType;
      uVar7 = VMFunctionBuilder::RegAvailability::Get(build->Registers + uVar14,1);
      uVar8 = *(byte *)(pPVar10[1].super_PTypeBase.super_DObject._vptr_DObject + 0xd) + 1;
LAB_00531eee:
      uVar18 = (uint)uVar14;
      VMFunctionBuilder::Emit(build,uVar8,uVar7 & 0xffff,uVar4 & 0xffff,uVar9);
      goto LAB_00531ef3;
    }
    if ((uVar7 & 1) == 0) {
      VMFunctionBuilder::Emit(build,0xcc,uVar4 & 0xffff,uVar4 & 0xffff,uVar9);
    }
    else {
      uVar7 = VMFunctionBuilder::RegAvailability::Get
                        (build->Registers + (((ulong)uVar4 & 0xff0000) >> 0x10),1);
      VMFunctionBuilder::Emit(build,0xcc,uVar7 & 0xffff,uVar4 & 0xffff,uVar9);
      uVar16 = 0x1000000;
      uVar14 = (ulong)uVar7;
    }
    uVar11 = uVar16 & 0xffffffff00000000;
  }
  else {
    pPVar3 = (PString *)this->index[1]._vptr_FxExpression;
    other = &this->index[1].ScriptPosition;
    if (pPVar3 == TypeString) {
      FString::AttachToOther(&local_38,&other->FileName);
    }
    else {
      local_38.Chars = (other->FileName).Chars;
    }
    BVar1 = (pPVar3->super_PBasicType).super_PType.RegType;
    if (BVar1 == '\x01') {
      uVar8 = (uint)(double)local_38.Chars;
    }
    else {
      uVar8 = 0;
      if (BVar1 == '\0') {
        uVar8 = (uint)local_38.Chars;
      }
    }
    if (pPVar3 == TypeString) {
      FString::~FString(&local_38);
    }
    if (*(uint *)&pPVar10[1].super_PTypeBase.super_DObject.Class <= uVar8) {
      __assert_fail("indexval < arraytype->ElementCount && \"Array index out of bounds\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0x1a7f,"virtual ExpEmit FxArrayElement::Emit(VMFunctionBuilder *)");
    }
    if (this->AddressRequested != true) {
      if ((extraout_var & 1) == 0) {
        if (bVar17 < 4 && (uVar7 & 1) == 0) {
          VMFunctionBuilder::RegAvailability::Return
                    (build->Registers + (uVar18 & 3),uVar4 & 0xffff,uVar4 >> 0x18);
        }
        uVar14 = (ulong)((this->super_FxExpression).ValueType)->RegType;
        uVar7 = VMFunctionBuilder::RegAvailability::Get(build->Registers + uVar14,1);
        bVar17 = *(byte *)(pPVar10[1].super_PTypeBase.super_DObject._vptr_DObject + 0xd);
        uVar9 = VMFunctionBuilder::GetConstantInt
                          (build,uVar8 * *(int *)((long)&pPVar10[1].super_PTypeBase.super_DObject.
                                                         Class + 4));
        uVar8 = (uint)bVar17;
        goto LAB_00531eee;
      }
      if (((this->super_FxExpression).ValueType)->RegType != bVar17) {
        __assert_fail("start.RegType == ValueType->GetRegType()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                      ,0x1a9f,"virtual ExpEmit FxArrayElement::Emit(VMFunctionBuilder *)");
      }
      uVar14 = ((ulong)uVar4 & 0xff0000) >> 0x10;
      uVar7 = VMFunctionBuilder::RegAvailability::Get(build->Registers + uVar14,1);
      VMFunctionBuilder::Emit(build,Emit::LK_Ops[uVar14],uVar7 & 0xffff,(short)uVar8 + (short)uVar4)
      ;
LAB_00531ef3:
      uVar14 = (ulong)uVar7;
      uVar4 = 0x1000000;
      uVar11 = 0;
      goto LAB_00531efb;
    }
    uVar16 = (ulong)(extraout_var >> 0x10);
    local_68 = (ulong)uVar7;
    if (uVar8 != 0) {
      iVar5 = uVar8 * *(int *)((long)&pPVar10[1].super_PTypeBase.super_DObject.Class + 4);
      if ((uVar7 & 1) == 0) {
        uVar7 = VMFunctionBuilder::GetConstantInt(build,iVar5);
        VMFunctionBuilder::Emit(build,0xcd,uVar4 & 0xffff,uVar4 & 0xffff,uVar7);
      }
      else {
        uVar7 = VMFunctionBuilder::RegAvailability::Get
                          (build->Registers + (((ulong)uVar4 & 0xff0000) >> 0x10),1);
        uVar8 = VMFunctionBuilder::GetConstantInt(build,iVar5);
        VMFunctionBuilder::Emit(build,0xcd,uVar7 & 0xffff,uVar4 & 0xffff,uVar8);
        uVar19 = 1;
        local_80 = 0;
        local_68 = 0;
        uVar16 = 0;
        uVar14 = (ulong)uVar7;
      }
    }
    uVar11 = (local_80 & 0xff) << 0x20 | (local_68 & 0xff) << 0x28 | uVar16 << 0x30;
    uVar16 = uVar19 << 0x18;
  }
  uVar4 = (uint)uVar16;
LAB_00531efb:
  return (ExpEmit)(uVar14 & 0xffff | (ulong)(uVar4 & 0xff000000) | uVar11 |
                  (ulong)((uVar18 & 0xff) << 0x10));
}

Assistant:

ExpEmit FxArrayElement::Emit(VMFunctionBuilder *build)
{
	PArray *arraytype;
	
	if (arrayispointer)
	{
		arraytype = static_cast<PArray*>(static_cast<PPointer*>(Array->ValueType)->PointedType);
	}
	else
	{
		arraytype = static_cast<PArray*>(Array->ValueType);
	}
	ExpEmit start = Array->Emit(build);

	/* what was this for?
	if (start.Konst)
	{
		ExpEmit tmpstart(build, REGT_POINTER);
		build->Emit(OP_LKP, tmpstart.RegNum, start.RegNum);
		start.Free(build);
		start = tmpstart;
	}
	*/
	if (index->isConstant())
	{
		unsigned indexval = static_cast<FxConstant *>(index)->GetValue().GetInt();
		assert(indexval < arraytype->ElementCount && "Array index out of bounds");

		if (AddressRequested)
		{
			if (indexval != 0)
			{
				indexval *= arraytype->ElementSize;
				if (!start.Fixed)
				{
					build->Emit(OP_ADDA_RK, start.RegNum, start.RegNum, build->GetConstantInt(indexval));
				}
				else
				{
					// do not clobber local variables.
					ExpEmit temp(build, start.RegType);
					build->Emit(OP_ADDA_RK, temp.RegNum, start.RegNum, build->GetConstantInt(indexval));
					start.Free(build);
					start = temp;
				}
			}
			return start;
		}
		else if (!start.Konst)
		{
			start.Free(build);
			ExpEmit dest(build, ValueType->GetRegType());
			build->Emit(arraytype->ElementType->GetLoadOp(), dest.RegNum, start.RegNum, build->GetConstantInt(indexval* arraytype->ElementSize));
			return dest;
		}
		else
		{
			static int LK_Ops[] = { OP_LK, OP_LKF, OP_LKS, OP_LKP };
			assert(start.RegType == ValueType->GetRegType());
			ExpEmit dest(build, start.RegType);
			build->Emit(LK_Ops[start.RegType], dest.RegNum, start.RegNum + indexval);
			return dest;
		}
	}
	else
	{
		ExpEmit indexv(index->Emit(build));
		// Todo: For dynamically allocated arrays (like global sector and linedef tables) we need to get the bound value in here somehow.
		// Right now their bounds are not properly checked for.
		if (arraytype->ElementCount > 65535)
		{
			build->Emit(OP_BOUND_K, indexv.RegNum, build->GetConstantInt(arraytype->ElementCount));
		}
		else
		{
			build->Emit(OP_BOUND, indexv.RegNum, arraytype->ElementCount);
		}

		if (!start.Konst)
		{
			int shiftbits = 0;
			while (1u << shiftbits < arraytype->ElementSize)
			{
				shiftbits++;
			}
			ExpEmit indexwork = indexv.Fixed && arraytype->ElementSize > 1 ? ExpEmit(build, indexv.RegType) : indexv;
			if (1u << shiftbits == arraytype->ElementSize)
			{
				if (shiftbits > 0)
				{
					build->Emit(OP_SLL_RI, indexwork.RegNum, indexv.RegNum, shiftbits);
				}
			}
			else
			{
				// A shift won't do, so use a multiplication
				build->Emit(OP_MUL_RK, indexwork.RegNum, indexv.RegNum, build->GetConstantInt(arraytype->ElementSize));
			}
			indexwork.Free(build);

			if (AddressRequested)
			{
				if (!start.Fixed)
				{
					build->Emit(OP_ADDA_RR, start.RegNum, start.RegNum, indexwork.RegNum);
				}
				else
				{
					start.Free(build);
					// do not clobber local variables.
					ExpEmit temp(build, start.RegType);
					build->Emit(OP_ADDA_RR, temp.RegNum, start.RegNum, indexwork.RegNum);
					start = temp;
				}
				return start;
			}
			else
			{
				start.Free(build);
				ExpEmit dest(build, ValueType->GetRegType());
				// added 1 to use the *_R version that takes the offset from a register
				build->Emit(arraytype->ElementType->GetLoadOp() + 1, dest.RegNum, start.RegNum, indexwork.RegNum);
				return dest;
			}
		}
		else
		{
			static int LKR_Ops[] = { OP_LK_R, OP_LKF_R, OP_LKS_R, OP_LKP_R };
			assert(start.RegType == ValueType->GetRegType());
			ExpEmit dest(build, start.RegType);
			if (start.RegNum <= 255)
			{
				// Since large constant tables are the exception, the constant component in C is an immediate value here.
				build->Emit(LKR_Ops[start.RegType], dest.RegNum, indexv.RegNum, start.RegNum);
			}
			else
			{
				build->Emit(OP_ADD_RK, indexv.RegNum, indexv.RegNum, build->GetConstantInt(start.RegNum));
				build->Emit(LKR_Ops[start.RegType], dest.RegNum, indexv.RegNum, 0);
			}
			indexv.Free(build);
			return dest;
		}
	}
}